

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_19::BinaryReader::ReadExceptionType(BinaryReader *this,TypeVector *sig)

{
  Type TVar1;
  bool bVar2;
  Result result;
  reference pvVar3;
  Type local_30;
  uint local_2c;
  Type value_type;
  Index j;
  TypeVector *pTStack_20;
  Index num_values;
  TypeVector *sig_local;
  BinaryReader *this_local;
  
  pTStack_20 = sig;
  sig_local = (TypeVector *)this;
  value_type = (Type)ReadCount(this,&j,"exception type count");
  bVar2 = Failed((Result)value_type);
  if (bVar2) {
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  else {
    std::vector<wabt::Type,_std::allocator<wabt::Type>_>::resize(pTStack_20,(ulong)j);
    for (local_2c = 0; local_2c < j; local_2c = local_2c + 1) {
      result = ReadType(this,&local_30,"exception value type");
      bVar2 = Failed(result);
      if (bVar2) {
        Result::Result((Result *)((long)&this_local + 4),Error);
        return (Result)this_local._4_4_;
      }
      bVar2 = IsConcreteType(this,local_30);
      TVar1 = local_30;
      if (!bVar2) {
        PrintError(this,"excepted valid exception value type (got %d)",(ulong)(uint)local_30);
        Result::Result((Result *)((long)&this_local + 4),Error);
        return (Result)this_local._4_4_;
      }
      pvVar3 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::operator[]
                         (pTStack_20,(ulong)local_2c);
      *pvVar3 = TVar1;
    }
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReader::ReadExceptionType(TypeVector& sig) {
  Index num_values;
  CHECK_RESULT(ReadCount(&num_values, "exception type count"));
  sig.resize(num_values);
  for (Index j = 0; j < num_values; ++j) {
    Type value_type;
    CHECK_RESULT(ReadType(&value_type, "exception value type"));
    ERROR_UNLESS(IsConcreteType(value_type),
                 "excepted valid exception value type (got %d)",
                 static_cast<int>(value_type));
    sig[j] = value_type;
  }
  return Result::Ok;
}